

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_typeSlot_create
          (sysbvm_context_t *context,sysbvm_tuple_t owner,sysbvm_tuple_t name,sysbvm_tuple_t flags,
          sysbvm_tuple_t type,size_t localIndex,size_t index)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).typeSlotType,0xb);
  psVar1[1].field_1.pointers[0] = flags;
  psVar1[1].header.field_0.typePointer = owner;
  (psVar1->field_1).pointers[0] = name;
  psVar1[2].header.field_0.typePointer = type;
  if (localIndex + 0x800000000000000 >> 0x3c == 0) {
    sVar2 = localIndex << 4 | 0xb;
  }
  else {
    sVar2 = sysbvm_tuple_uint64_encodeBig(context,localIndex);
  }
  psVar1[2].field_1.pointers[0] = sVar2;
  if (index + 0x800000000000000 < 0x1000000000000000) {
    sVar2 = index << 4 | 0xb;
  }
  else {
    sVar2 = sysbvm_tuple_uint64_encodeBig(context,index);
  }
  psVar1[3].header.field_0.typePointer = sVar2;
  psVar1[3].header.identityHashAndFlags = 0xb;
  psVar1[3].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_typeSlot_create(sysbvm_context_t *context, sysbvm_tuple_t owner, sysbvm_tuple_t name, sysbvm_tuple_t flags, sysbvm_tuple_t type, size_t localIndex, size_t index)
{
    sysbvm_typeSlot_t* result = (sysbvm_typeSlot_t*)sysbvm_context_allocatePointerTuple(context, context->roots.typeSlotType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_typeSlot_t));
    result->flags = flags;
    result->super.owner = owner;
    result->super.name = name;
    result->type = type;
    result->localIndex = sysbvm_tuple_size_encode(context, localIndex);
    result->index = sysbvm_tuple_size_encode(context, index);
    result->offset = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}